

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.h
# Opt level: O0

void idx2::ReadLines<256>(FILE *Fp,array<idx2::stack_array<char,_256>_> *Lines)

{
  char *pcVar1;
  size_t sVar2;
  anon_union_8_2_2df48d06_for_stref_0 local_188;
  stref Dst;
  stref Src;
  char Temp [256];
  array<idx2::stack_array<char,_256>_> *Lines_local;
  FILE *Fp_local;
  
  while( true ) {
    pcVar1 = fgets((char *)&Src.Size,0x100,(FILE *)Fp);
    if (pcVar1 == (char *)0x0) break;
    Dst._8_8_ = &Src.Size;
    sVar2 = strlen((char *)Dst._8_8_);
    if (Temp[(long)((int)sVar2 + -1) + -8] == '\n') {
      Temp[(long)((int)sVar2 + -2) + -8] = '\0';
    }
    if (Lines->Capacity <= Lines->Size) {
      GrowCapacity<idx2::stack_array<char,256>>(Lines,0);
    }
    Lines->Size = Lines->Size + 1;
    local_188.Ptr = (str)((Lines->Buffer).Data + (Lines->Size + -1) * 0x101);
    Dst.field_0._0_4_ = 0x100;
    Copy((stref *)&Dst.Size,(stref *)&local_188,true);
  }
  return;
}

Assistant:

void
ReadLines(FILE* Fp, array<stack_array<char, N>>* Lines)
{
  while (true)
  {
    char Temp[N];
    if (!fgets(Temp, N, Fp))
      return;

    stref Src(Temp);
    if (Temp[Src.Size - 1] == '\n')
      Temp[Src.Size - 2] = 0; // override the new line character
    PushBack(Lines);
    stref Dst(Back(*Lines).Arr, N);
    Copy(Src, &Dst, true);
  }
}